

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

int read_cached_features(vw *all,v_array<example_*> *examples)

{
  ulong *puVar1;
  example *ae;
  io_buf *piVar2;
  ulong n;
  vw *pvVar3;
  ulong *puVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ostream *poVar8;
  _func_int **pp_Var9;
  byte bVar10;
  char cVar11;
  int iVar12;
  byte bVar13;
  ulong uVar14;
  features *this;
  feature_index i;
  feature_value v;
  char *c;
  byte local_59;
  ulong *local_58;
  features *local_50;
  io_buf *local_48;
  vw *local_40;
  size_t local_38;
  
  ae = *examples->_begin;
  ae->sorted = all->p->sorted_cache;
  piVar2 = all->p->input;
  sVar5 = (*(all->p->lp).read_cached_label)(all->sd,&ae->l,piVar2);
  iVar12 = 0;
  if (sVar5 != 0) {
    sVar6 = read_cached_tag(piVar2,ae);
    if (sVar6 != 0) {
      sVar6 = io_buf::buf_read(piVar2,(char **)&local_58,1);
      if (sVar6 == 0) {
LAB_0024bfdf:
        iVar12 = 0;
      }
      else {
        cVar11 = (char)*local_58;
        local_58 = (ulong *)((long)local_58 + 1);
        all->p->input->head = (char *)local_58;
        if (cVar11 != '\0') {
          local_50 = (ae->super_example_predict).feature_space;
          local_48 = piVar2;
          local_40 = all;
          do {
            pvVar3 = local_40;
            piVar2 = local_48;
            local_38 = sVar5;
            sVar5 = io_buf::buf_read(local_48,(char **)&local_58,9);
            if (sVar5 < 9) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&(pvVar3->trace_message).super_ostream,"truncated example! ",0x13);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar3->trace_message);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              pp_Var9 = poVar8->_vptr_basic_ostream;
LAB_0024bfbb:
              std::ios::widen((char)pp_Var9[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_0024bfdf;
            }
            local_59 = (byte)*local_58;
            uVar14 = (ulong)local_59;
            local_58 = (ulong *)((long)local_58 + 1);
            v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ae,&local_59);
            n = *local_58;
            local_58 = local_58 + 1;
            pvVar3->p->input->head = (char *)local_58;
            sVar5 = io_buf::buf_read(piVar2,(char **)&local_58,n);
            if (sVar5 < n) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&(pvVar3->trace_message).super_ostream,"truncated example! wanted: ",0x1b);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar3->trace_message);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes",6);
              pp_Var9 = poVar8->_vptr_basic_ostream;
              goto LAB_0024bfbb;
            }
            if (n != 0) {
              this = local_50 + uVar14;
              puVar1 = (ulong *)((long)local_58 + n);
              i = 0;
              do {
                bVar13 = (byte)*local_58;
                if ((char)bVar13 < '\0') {
                  bVar10 = 0;
                  uVar14 = 0;
                  do {
                    uVar14 = uVar14 | (ulong)(bVar13 & 0x7f) << (bVar10 & 0x3f);
                    bVar13 = *(byte *)((long)local_58 + 1);
                    local_58 = (ulong *)((long)local_58 + 1);
                    bVar10 = bVar10 + 7;
                  } while ((char)bVar13 < '\0');
                }
                else {
                  uVar14 = 0;
                  bVar10 = 0;
                }
                uVar14 = (ulong)bVar13 << (bVar10 & 0x3f) | uVar14;
                v = -1.0;
                puVar4 = (ulong *)((long)local_58 + 1);
                if (((uVar14 & 1) == 0) && (v = 1.0, (uVar14 & 2) != 0)) {
                  v = *(feature_value *)((long)local_58 + 1);
                  puVar4 = (ulong *)((long)local_58 + 5);
                }
                local_58 = puVar4;
                uVar7 = (long)(uVar14 << 0x3d) >> 0x3f;
                if ((long)uVar7 < 0) {
                  ae->sorted = false;
                }
                i = i + (uVar7 ^ uVar14 >> 3);
                features::push_back(this,v,i);
              } while (local_58 != puVar1);
            }
            sVar5 = local_38 + n;
            local_40->p->input->head = (char *)local_58;
            cVar11 = cVar11 + -1;
          } while (cVar11 != '\0');
        }
        iVar12 = (int)sVar5;
      }
    }
  }
  return iVar12;
}

Assistant:

int read_cached_features(vw* all, v_array<example*>& examples)
{
  example* ae = examples[0];
  ae->sorted = all->p->sorted_cache;
  io_buf* input = all->p->input;

  size_t total = all->p->lp.read_cached_label(all->sd, &ae->l, *input);
  if (total == 0)
    return 0;
  if (read_cached_tag(*input, ae) == 0)
    return 0;
  char* c;
  unsigned char num_indices = 0;
  if (input->buf_read(c, sizeof(num_indices)) < sizeof(num_indices))
    return 0;
  num_indices = *(unsigned char*)c;
  c += sizeof(num_indices);

  all->p->input->set(c);
  for (; num_indices > 0; num_indices--)
  {
    size_t temp;
    unsigned char index = 0;
    if ((temp = input->buf_read(c, sizeof(index) + sizeof(size_t))) < sizeof(index) + sizeof(size_t))
    {
      all->trace_message << "truncated example! " << temp << " " << char_size + sizeof(size_t) << endl;
      return 0;
    }

    index = *(unsigned char*)c;
    c += sizeof(index);
    ae->indices.push_back((size_t)index);
    features& ours = ae->feature_space[index];
    size_t storage = *(size_t*)c;
    c += sizeof(size_t);
    all->p->input->set(c);
    total += storage;
    if (input->buf_read(c, storage) < storage)
    {
      all->trace_message << "truncated example! wanted: " << storage << " bytes" << endl;
      return 0;
    }

    char* end = c + storage;

    uint64_t last = 0;

    for (; c != end;)
    {
      feature_index i = 0;
      c = run_len_decode(c, i);
      feature_value v = 1.f;
      if (i & neg_1)
        v = -1.;
      else if (i & general)
      {
        v = ((one_float*)c)->f;
        c += sizeof(float);
      }
      uint64_t diff = i >> 2;
      int64_t s_diff = ZigZagDecode(diff);
      if (s_diff < 0)
        ae->sorted = false;
      i = last + s_diff;
      last = i;
      ours.push_back(v, i);
    }
    all->p->input->set(c);
  }

  return (int)total;
}